

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Epnp.cpp
# Opt level: O1

void __thiscall
opengv::absolute_pose::modules::Epnp::compute_L_6x10
          (Epnp *this,MatrixXd *Ut,Matrix<double,_6,_10,_0,_6,_10> *L_6x10)

{
  uint uVar1;
  double *pdVar2;
  long lVar3;
  bool bVar4;
  bool bVar5;
  ulong uVar6;
  uint uVar7;
  undefined1 *puVar9;
  long lVar10;
  int iVar11;
  long lVar12;
  uint uVar13;
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined4 local_258 [4];
  undefined1 local_248 [128];
  undefined4 auStack_1c8 [36];
  undefined4 auStack_138 [36];
  undefined4 auStack_a8 [38];
  ulong uVar8;
  
  pdVar2 = (Ut->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data;
  lVar3 = (Ut->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows;
  puVar9 = local_248;
  lVar10 = 0;
  do {
    iVar11 = 0xb - (int)lVar10;
    uVar13 = 1;
    lVar12 = 0;
    uVar7 = 0;
    do {
      *(double *)(puVar9 + lVar12 + -0x10) =
           *(double *)((long)pdVar2 + (ulong)(uVar7 * 3) * lVar3 * 8 + (ulong)(uint)(iVar11 * 8)) -
           *(double *)((long)pdVar2 + (int)(uVar13 * 3) * lVar3 * 8 + (ulong)(uint)(iVar11 * 8));
      *(double *)(puVar9 + lVar12 + -8) =
           *(double *)
            ((long)pdVar2 + (ulong)(uVar7 * 3 + 1) * lVar3 * 8 + (ulong)(uint)(iVar11 * 8)) -
           *(double *)((long)pdVar2 + (int)(uVar13 * 3 + 1) * lVar3 * 8 + (ulong)(uint)(iVar11 * 8))
      ;
      *(double *)(puVar9 + lVar12) =
           *(double *)
            ((long)pdVar2 + (ulong)(uVar7 * 3 + 2) * lVar3 * 8 + (ulong)(uint)(iVar11 * 8)) -
           *(double *)((long)pdVar2 + (int)(uVar13 * 3 + 2) * lVar3 * 8 + (ulong)(uint)(iVar11 * 8))
      ;
      uVar1 = uVar13 + 1;
      uVar6 = (ulong)uVar1;
      bVar5 = 2 < (int)uVar13;
      bVar4 = (int)uVar13 < 3;
      uVar13 = uVar7 + 2;
      if (bVar4) {
        uVar13 = uVar1;
      }
      uVar7 = bVar5 + uVar7;
      uVar8 = (ulong)uVar7;
      lVar12 = lVar12 + 0x18;
    } while (lVar12 != 0x90);
    lVar10 = lVar10 + 1;
    puVar9 = puVar9 + 0x90;
  } while (lVar10 != 4);
  auVar14 = vgatherdpd_avx512f(*(undefined4 *)((long)local_258 + lVar3));
  auVar14 = ZEXT4864(auVar14._0_48_);
  auVar15 = vgatherdpd_avx512f(*(undefined4 *)((long)local_258 + uVar6));
  auVar15 = ZEXT4864(auVar15._0_48_);
  auVar16 = vmulpd_avx512f(auVar15,auVar15);
  auVar16 = vfmadd231pd_avx512f(auVar16,auVar14,auVar14);
  auVar17 = vgatherdpd_avx512f(*(undefined4 *)((long)local_258 + uVar8));
  auVar17 = ZEXT4864(auVar17._0_48_);
  auVar16 = vfmadd231pd_avx512f(auVar16,auVar17,auVar17);
  auVar16._48_8_ =
       (L_6x10->super_PlainObjectBase<Eigen::Matrix<double,_6,_10,_0,_6,_10>_>).m_storage.m_data.
       array[6];
  auVar16._56_8_ =
       (L_6x10->super_PlainObjectBase<Eigen::Matrix<double,_6,_10,_0,_6,_10>_>).m_storage.m_data.
       array[7];
  *(undefined1 (*) [64])
   (L_6x10->super_PlainObjectBase<Eigen::Matrix<double,_6,_10,_0,_6,_10>_>).m_storage.m_data.array =
       auVar16;
  auVar16 = vgatherdpd_avx512f(*(undefined4 *)((long)auStack_1c8 + lVar3));
  auVar16 = ZEXT4864(auVar16._0_48_);
  auVar18 = vgatherdpd_avx512f(*(undefined4 *)((long)auStack_1c8 + uVar6));
  auVar18 = ZEXT4864(auVar18._0_48_);
  auVar19 = vmulpd_avx512f(auVar15,auVar18);
  auVar19 = vfmadd231pd_avx512f(auVar19,auVar14,auVar16);
  auVar20 = vgatherdpd_avx512f(*(undefined4 *)((long)auStack_1c8 + uVar8));
  auVar20 = ZEXT4864(auVar20._0_48_);
  auVar19 = vfmadd231pd_avx512f(auVar19,auVar17,auVar20);
  auVar19 = vaddpd_avx512f(auVar19,auVar19);
  auVar19._48_8_ =
       (L_6x10->super_PlainObjectBase<Eigen::Matrix<double,_6,_10,_0,_6,_10>_>).m_storage.m_data.
       array[0xc];
  auVar19._56_8_ =
       (L_6x10->super_PlainObjectBase<Eigen::Matrix<double,_6,_10,_0,_6,_10>_>).m_storage.m_data.
       array[0xd];
  *(undefined1 (*) [64])
   ((L_6x10->super_PlainObjectBase<Eigen::Matrix<double,_6,_10,_0,_6,_10>_>).m_storage.m_data.array
   + 6) = auVar19;
  auVar19 = vmulpd_avx512f(auVar18,auVar18);
  auVar19 = vfmadd231pd_avx512f(auVar19,auVar16,auVar16);
  auVar19 = vfmadd231pd_avx512f(auVar19,auVar20,auVar20);
  auVar21._0_48_ = auVar19._0_48_;
  auVar21._48_8_ =
       (L_6x10->super_PlainObjectBase<Eigen::Matrix<double,_6,_10,_0,_6,_10>_>).m_storage.m_data.
       array[0x12];
  auVar21._56_8_ =
       (L_6x10->super_PlainObjectBase<Eigen::Matrix<double,_6,_10,_0,_6,_10>_>).m_storage.m_data.
       array[0x13];
  *(undefined1 (*) [64])
   ((L_6x10->super_PlainObjectBase<Eigen::Matrix<double,_6,_10,_0,_6,_10>_>).m_storage.m_data.array
   + 0xc) = auVar21;
  auVar19 = vgatherdpd_avx512f(*(undefined4 *)((long)auStack_138 + lVar3));
  auVar19 = ZEXT4864(auVar19._0_48_);
  auVar21 = vgatherdpd_avx512f(*(undefined4 *)((long)auStack_138 + uVar6));
  auVar21 = ZEXT4864(auVar21._0_48_);
  auVar22 = vmulpd_avx512f(auVar15,auVar21);
  auVar22 = vfmadd231pd_avx512f(auVar22,auVar14,auVar19);
  auVar23 = vgatherdpd_avx512f(*(undefined4 *)((long)auStack_138 + uVar8));
  auVar23 = ZEXT4864(auVar23._0_48_);
  auVar22 = vfmadd231pd_avx512f(auVar22,auVar17,auVar23);
  auVar22 = vaddpd_avx512f(auVar22,auVar22);
  auVar22._48_8_ =
       (L_6x10->super_PlainObjectBase<Eigen::Matrix<double,_6,_10,_0,_6,_10>_>).m_storage.m_data.
       array[0x18];
  auVar22._56_8_ =
       (L_6x10->super_PlainObjectBase<Eigen::Matrix<double,_6,_10,_0,_6,_10>_>).m_storage.m_data.
       array[0x19];
  *(undefined1 (*) [64])
   ((L_6x10->super_PlainObjectBase<Eigen::Matrix<double,_6,_10,_0,_6,_10>_>).m_storage.m_data.array
   + 0x12) = auVar22;
  auVar22 = vmulpd_avx512f(auVar18,auVar21);
  auVar22 = vfmadd231pd_avx512f(auVar22,auVar16,auVar19);
  auVar22 = vfmadd231pd_avx512f(auVar22,auVar20,auVar23);
  auVar22 = vaddpd_avx512f(auVar22,auVar22);
  auVar25._0_48_ = auVar22._0_48_;
  auVar25._48_8_ =
       (L_6x10->super_PlainObjectBase<Eigen::Matrix<double,_6,_10,_0,_6,_10>_>).m_storage.m_data.
       array[0x1e];
  auVar25._56_8_ =
       (L_6x10->super_PlainObjectBase<Eigen::Matrix<double,_6,_10,_0,_6,_10>_>).m_storage.m_data.
       array[0x1f];
  *(undefined1 (*) [64])
   ((L_6x10->super_PlainObjectBase<Eigen::Matrix<double,_6,_10,_0,_6,_10>_>).m_storage.m_data.array
   + 0x18) = auVar25;
  auVar22 = vmulpd_avx512f(auVar21,auVar21);
  auVar22 = vfmadd231pd_avx512f(auVar22,auVar19,auVar19);
  auVar22 = vfmadd231pd_avx512f(auVar22,auVar23,auVar23);
  auVar24._0_48_ = auVar22._0_48_;
  auVar24._48_8_ =
       (L_6x10->super_PlainObjectBase<Eigen::Matrix<double,_6,_10,_0,_6,_10>_>).m_storage.m_data.
       array[0x24];
  auVar24._56_8_ =
       (L_6x10->super_PlainObjectBase<Eigen::Matrix<double,_6,_10,_0,_6,_10>_>).m_storage.m_data.
       array[0x25];
  *(undefined1 (*) [64])
   ((L_6x10->super_PlainObjectBase<Eigen::Matrix<double,_6,_10,_0,_6,_10>_>).m_storage.m_data.array
   + 0x1e) = auVar24;
  auVar22 = vgatherdpd_avx512f(*(undefined4 *)((long)auStack_a8 + lVar3));
  auVar22 = ZEXT4864(auVar22._0_48_);
  auVar25 = vgatherdpd_avx512f(*(undefined4 *)((long)auStack_a8 + uVar6));
  auVar25 = ZEXT4864(auVar25._0_48_);
  auVar15 = vmulpd_avx512f(auVar15,auVar25);
  auVar14 = vfmadd231pd_avx512f(auVar15,auVar22,auVar14);
  auVar15 = vgatherdpd_avx512f(*(undefined4 *)((long)auStack_a8 + uVar8));
  auVar15 = ZEXT4864(auVar15._0_48_);
  auVar14 = vfmadd231pd_avx512f(auVar14,auVar15,auVar17);
  auVar14 = vaddpd_avx512f(auVar14,auVar14);
  auVar14._48_8_ =
       (L_6x10->super_PlainObjectBase<Eigen::Matrix<double,_6,_10,_0,_6,_10>_>).m_storage.m_data.
       array[0x2a];
  auVar14._56_8_ =
       (L_6x10->super_PlainObjectBase<Eigen::Matrix<double,_6,_10,_0,_6,_10>_>).m_storage.m_data.
       array[0x2b];
  *(undefined1 (*) [64])
   ((L_6x10->super_PlainObjectBase<Eigen::Matrix<double,_6,_10,_0,_6,_10>_>).m_storage.m_data.array
   + 0x24) = auVar14;
  auVar14 = vmulpd_avx512f(auVar18,auVar25);
  auVar14 = vfmadd231pd_avx512f(auVar14,auVar22,auVar16);
  auVar14 = vfmadd231pd_avx512f(auVar14,auVar15,auVar20);
  auVar14 = vaddpd_avx512f(auVar14,auVar14);
  auVar17._0_48_ = auVar14._0_48_;
  auVar17._48_8_ =
       (L_6x10->super_PlainObjectBase<Eigen::Matrix<double,_6,_10,_0,_6,_10>_>).m_storage.m_data.
       array[0x30];
  auVar17._56_8_ =
       (L_6x10->super_PlainObjectBase<Eigen::Matrix<double,_6,_10,_0,_6,_10>_>).m_storage.m_data.
       array[0x31];
  *(undefined1 (*) [64])
   ((L_6x10->super_PlainObjectBase<Eigen::Matrix<double,_6,_10,_0,_6,_10>_>).m_storage.m_data.array
   + 0x2a) = auVar17;
  auVar14 = vmulpd_avx512f(auVar21,auVar25);
  auVar14 = vfmadd231pd_avx512f(auVar14,auVar22,auVar19);
  auVar14 = vfmadd231pd_avx512f(auVar14,auVar15,auVar23);
  auVar14 = vaddpd_avx512f(auVar14,auVar14);
  auVar18._0_48_ = auVar14._0_48_;
  auVar18._48_8_ =
       (L_6x10->super_PlainObjectBase<Eigen::Matrix<double,_6,_10,_0,_6,_10>_>).m_storage.m_data.
       array[0x36];
  auVar18._56_8_ =
       (L_6x10->super_PlainObjectBase<Eigen::Matrix<double,_6,_10,_0,_6,_10>_>).m_storage.m_data.
       array[0x37];
  *(undefined1 (*) [64])
   ((L_6x10->super_PlainObjectBase<Eigen::Matrix<double,_6,_10,_0,_6,_10>_>).m_storage.m_data.array
   + 0x30) = auVar18;
  auVar14 = vmulpd_avx512f(auVar25,auVar25);
  auVar14 = vfmadd231pd_avx512f(auVar14,auVar22,auVar22);
  auVar14 = vfmadd231pd_avx512f(auVar14,auVar15,auVar15);
  auVar15._0_48_ = auVar14._0_48_;
  auVar15._48_8_ =
       L_6x10[1].super_PlainObjectBase<Eigen::Matrix<double,_6,_10,_0,_6,_10>_>.m_storage.m_data.
       array[0];
  auVar15._56_8_ =
       L_6x10[1].super_PlainObjectBase<Eigen::Matrix<double,_6,_10,_0,_6,_10>_>.m_storage.m_data.
       array[1];
  *(undefined1 (*) [64])
   ((L_6x10->super_PlainObjectBase<Eigen::Matrix<double,_6,_10,_0,_6,_10>_>).m_storage.m_data.array
   + 0x36) = auVar15;
  return;
}

Assistant:

void
opengv::absolute_pose::modules::Epnp::compute_L_6x10(
    const Eigen::MatrixXd & Ut,
    Eigen::Matrix<double,6,10> & L_6x10 )
{
  double dv[4][6][3];

  for(int i = 0; i < 4; i++)
  {
    int a = 0, b = 1;
    for(int j = 0; j < 6; j++)
    {
      dv[i][j][0] = Ut(11-i,3 * a    ) - Ut(11-i,3 * b);
      dv[i][j][1] = Ut(11-i,3 * a + 1) - Ut(11-i,3 * b + 1);
      dv[i][j][2] = Ut(11-i,3 * a + 2) - Ut(11-i,3 * b + 2);

      b++;
      if (b > 3)
      {
        a++;
        b = a + 1;
      }
    }
  }

  for(int i = 0; i < 6; i++)
  {
    L_6x10(i,0) =        dot(dv[0][i], dv[0][i]);
    L_6x10(i,1) = 2.0f * dot(dv[0][i], dv[1][i]);
    L_6x10(i,2) =        dot(dv[1][i], dv[1][i]);
    L_6x10(i,3) = 2.0f * dot(dv[0][i], dv[2][i]);
    L_6x10(i,4) = 2.0f * dot(dv[1][i], dv[2][i]);
    L_6x10(i,5) =        dot(dv[2][i], dv[2][i]);
    L_6x10(i,6) = 2.0f * dot(dv[0][i], dv[3][i]);
    L_6x10(i,7) = 2.0f * dot(dv[1][i], dv[3][i]);
    L_6x10(i,8) = 2.0f * dot(dv[2][i], dv[3][i]);
    L_6x10(i,9) =        dot(dv[3][i], dv[3][i]);
  }
}